

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
ARAPlanner::GetSearchPath(ARAPlanner *this,ARASearchStateSpace_t *pSearchStateSpace,int *solcost)

{
  long lVar1;
  undefined8 uVar2;
  size_type sVar3;
  int *in_RCX;
  long in_RDX;
  long *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  int actioncost;
  FILE *fOut;
  CMDPSTATE *startstate;
  CMDPSTATE *goalstate;
  CMDPSTATE *state;
  ARAState *searchstateinfo;
  vector<int,_std::allocator<int>_> CostV;
  vector<int,_std::allocator<int>_> SuccIDV;
  vector<int,_std::allocator<int>_> *wholePathIds;
  reference in_stack_ffffffffffffff28;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  reference in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_98;
  int local_94;
  int *local_78;
  int *local_70;
  int *local_68;
  undefined1 local_50 [24];
  vector<int,_std::allocator<int>_> local_38;
  int *local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19c93e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19c94b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19c95d);
  if ((*(byte *)(in_RSI + 0xf) & 1) == 0) {
    local_78 = *(int **)(local_18 + 0x28);
    local_70 = *(int **)(local_18 + 0x30);
  }
  else {
    local_78 = *(int **)(local_18 + 0x30);
    local_70 = *(int **)(local_18 + 0x28);
    (**(code **)(*in_RSI + 0x170))(in_RSI,local_18);
  }
  local_68 = local_78;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  *local_20 = 0;
  if (_stdout == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    __cxa_throw(uVar2,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  while ((((*local_68 != *local_70 && (*(long *)(local_68 + 0xe) != 0)) &&
          (lVar1 = *(long *)(local_68 + 0xe), *(long *)(lVar1 + 0x38) != 0)) &&
         (*(int *)(lVar1 + 0x24) != 1000000000))) {
    (**(code **)(*(long *)in_RSI[1] + 0x28))((long *)in_RSI[1],*local_68,&local_38,local_50);
    local_94 = 1000000000;
    local_98 = 0;
    while (in_stack_ffffffffffffff44 = local_98,
          sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_38),
          in_stack_ffffffffffffff44 < (int)sVar3) {
      in_stack_ffffffffffffff38 =
           std::vector<int,_std::allocator<int>_>::at
                     (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      if ((*in_stack_ffffffffffffff38 == **(int **)(lVar1 + 0x38)) &&
         (in_stack_ffffffffffffff30 =
               (vector<int,_std::allocator<int>_> *)
               std::vector<int,_std::allocator<int>_>::at
                         (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28),
         *(int *)&(in_stack_ffffffffffffff30->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                  .super__Vector_impl_data._M_start < local_94)) {
        in_stack_ffffffffffffff28 =
             std::vector<int,_std::allocator<int>_>::at
                       (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
        local_94 = *in_stack_ffffffffffffff28;
      }
      local_98 = local_98 + 1;
    }
    *local_20 = *local_20 + local_94;
    local_68 = *(int **)(lVar1 + 0x38);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return in_RDI;
}

Assistant:

vector<int> ARAPlanner::GetSearchPath(ARASearchStateSpace_t* pSearchStateSpace, int& solcost)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    vector<int> wholePathIds;
    ARAState* searchstateinfo;
    CMDPSTATE* state = NULL;
    CMDPSTATE* goalstate = NULL;
    CMDPSTATE* startstate = NULL;

    if (bforwardsearch) {
        startstate = pSearchStateSpace->searchstartstate;
        goalstate = pSearchStateSpace->searchgoalstate;

        //reconstruct the path by setting bestnextstate pointers appropriately
        ReconstructPath(pSearchStateSpace);
    }
    else {
        startstate = pSearchStateSpace->searchgoalstate;
        goalstate = pSearchStateSpace->searchstartstate;
    }

    state = startstate;

    wholePathIds.push_back(state->StateID);
    solcost = 0;

    FILE* fOut = stdout;
    if (fOut == NULL) {
        throw SBPL_Exception("ERROR: could not open file");
    }
    while (state->StateID != goalstate->StateID) {
        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ARAState*)state->PlannerSpecificData;

        if (searchstateinfo->bestnextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }

        environment_->GetSuccs(state->StateID, &SuccIDV, &CostV);
        int actioncost = INFINITECOST;
        for (int i = 0; i < (int)SuccIDV.size(); i++) {
            if (SuccIDV.at(i) == searchstateinfo->bestnextstate->StateID && CostV.at(i) < actioncost) {
                actioncost = CostV.at(i);
            }
        }
        if (actioncost == INFINITECOST) SBPL_PRINTF("WARNING: actioncost = %d\n", actioncost);

        solcost += actioncost;

        //SBPL_FPRINTF(fDeb, "actioncost=%d between states %d and %d\n",
        //        actioncost, state->StateID, searchstateinfo->bestnextstate->StateID);
        //environment_->PrintState(state->StateID, false, fDeb);
        //environment_->PrintState(searchstateinfo->bestnextstate->StateID, false, fDeb);

#if DEBUG
        ARAState* nextstateinfo = (ARAState*)(searchstateinfo->bestnextstate->PlannerSpecificData);
        if (actioncost != abs((int)(searchstateinfo->g - nextstateinfo->g)) &&
            pSearchStateSpace->eps_satisfied <= 1.001)
        {
            SBPL_FPRINTF(fDeb, "ERROR: actioncost=%d is not matching the difference in g-values of %d\n",
                         actioncost, abs((int)(searchstateinfo->g - nextstateinfo->g)));
            SBPL_ERROR("ERROR: actioncost=%d is not matching the difference in g-values of %d\n",
                       actioncost,abs((int)(searchstateinfo->g - nextstateinfo->g)));
            PrintSearchState(searchstateinfo, fDeb);
            PrintSearchState(nextstateinfo, fDeb);
        }
#endif

        state = searchstateinfo->bestnextstate;

        wholePathIds.push_back(state->StateID);
    }

    return wholePathIds;
}